

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O2

message * __thiscall booster::log::message::operator=(message *this,message *other)

{
  char *pcVar1;
  
  if (this != other) {
    this->level_ = other->level_;
    pcVar1 = other->file_name_;
    this->module_ = other->module_;
    this->file_name_ = pcVar1;
    this->file_line_ = other->file_line_;
    std::
    __uniq_ptr_impl<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=((__uniq_ptr_impl<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&this->message_,
                (__uniq_ptr_impl<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&other->message_);
  }
  return this;
}

Assistant:

message &message::operator=(message &&other) 
	{
		if(this!=&other) {
			level_ = other.level_;
			module_ = other.module_;
			file_name_=other.file_name_;
			file_line_=other.file_line_;
			message_=std::move(other.message_);
		}
		return *this;
	}